

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O3

Vec_Wrd_t * Gia_ManDeriveSigns(Gia_Man_t *p,Vec_Int_t *vPivots,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  Vec_Wrd_t *pVVar7;
  word *__s;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  word wVar11;
  long lVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  
  Gia_ManFillValue(p);
  iVar18 = vPivots->nSize;
  if (0 < (long)iVar18) {
    piVar4 = vPivots->pArray;
    lVar12 = 0;
    do {
      iVar1 = piVar4[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_006683d9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pObjs[iVar1].Value = (uint)lVar12;
      lVar12 = lVar12 + 1;
    } while (iVar18 != lVar12);
  }
  if (fVerbose != 0) {
    printf("Signature propagation: ");
  }
  uVar2 = p->nObjs;
  pVVar7 = (Vec_Wrd_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar8 = uVar2;
  }
  pVVar7->nCap = uVar8;
  if (uVar8 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar8 << 3);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = uVar2;
  memset(__s,0,(long)(int)uVar2 * 8);
  do {
    uVar8 = p->nObjs;
    if ((0 < (int)uVar8) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      puVar13 = &p->pObjs->Value;
      uVar14 = 0;
      do {
        uVar9 = *puVar13;
        if (uVar9 != 0xffffffff) {
          if (0x3f < uVar9) {
            __assert_fail("pObj->Value >= 0 && pObj->Value < 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                          ,0x1bf,"Vec_Wrd_t *Gia_ManDeriveSigns(Gia_Man_t *, Vec_Int_t *, int)");
          }
          if ((long)(int)uVar2 <= (long)uVar14) goto LAB_00668417;
          __s[uVar14] = __s[uVar14] | 1L << ((byte)uVar9 & 0x3f);
        }
        uVar10 = *(ulong *)(puVar13 + -2);
        uVar9 = (uint)uVar10;
        if ((uVar10 & 0x1fffffff) == 0x1fffffff || (int)uVar9 < 0) {
          if ((int)uVar9 < 0 && (int)(uVar10 & 0x1fffffff) != 0x1fffffff) {
            uVar10 = -(uVar9 & 0x1fffffff) + uVar14;
            iVar18 = (int)uVar10;
            if ((-1 < iVar18) && (iVar18 < (int)uVar2)) {
              if (uVar2 <= uVar14) goto LAB_00668417;
              wVar11 = __s[uVar10 & 0xffffffff];
              goto LAB_00668244;
            }
            goto LAB_006683ba;
          }
        }
        else {
          uVar15 = -(uVar9 & 0x1fffffff) + uVar14;
          iVar18 = (int)uVar15;
          if ((iVar18 < 0) || ((int)uVar2 <= iVar18)) goto LAB_006683ba;
          uVar10 = -((uint)(uVar10 >> 0x20) & 0x1fffffff) + uVar14;
          uVar9 = (uint)uVar10;
          if (((int)uVar9 < 0) || (uVar2 <= uVar9)) goto LAB_006683ba;
          if (uVar2 <= uVar14) {
LAB_00668417:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          wVar11 = __s[uVar10 & 0xffffffff] | __s[uVar15 & 0xffffffff];
LAB_00668244:
          __s[uVar14] = __s[uVar14] | wVar11;
        }
        uVar14 = uVar14 + 1;
        puVar13 = puVar13 + 3;
      } while (uVar8 != uVar14);
    }
    iVar18 = p->nRegs;
    lVar12 = (long)iVar18;
    if (lVar12 < 1) {
      if (fVerbose == 0) {
        return pVVar7;
      }
      printf("%d ",0);
LAB_0066839c:
      putchar(10);
      return pVVar7;
    }
    pVVar5 = p->vCos;
    iVar1 = pVVar5->nSize;
    uVar14 = (ulong)(uint)(iVar1 - iVar18);
    iVar18 = -iVar18;
    bVar6 = false;
    do {
      if ((iVar1 + iVar18 < 0) || (iVar1 <= iVar1 + iVar18)) {
LAB_006683f8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = pVVar5->pArray[uVar14];
      if (((long)(int)uVar9 < 0) || ((int)uVar8 <= (int)uVar9)) goto LAB_006683d9;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar3 = p->vCis->nSize;
      uVar16 = iVar18 + iVar3;
      if (((int)uVar16 < 0) || (iVar3 <= (int)uVar16)) goto LAB_006683f8;
      uVar16 = p->vCis->pArray[uVar16];
      lVar17 = (long)(int)uVar16;
      if ((lVar17 < 0) || (uVar8 <= uVar16)) goto LAB_006683d9;
      if (((int)uVar2 <= (int)uVar16) || (uVar2 <= uVar9)) {
LAB_006683ba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      uVar10 = __s[lVar17];
      uVar15 = __s[(int)uVar9] | uVar10;
      __s[lVar17] = uVar15;
      if (uVar10 != uVar15) {
        bVar6 = true;
      }
      iVar18 = iVar18 + 1;
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    if (fVerbose == 0) {
      if (!bVar6) {
        return pVVar7;
      }
    }
    else {
      printf("%d ");
      if (!bVar6) goto LAB_0066839c;
    }
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManDeriveSigns( Gia_Man_t * p, Vec_Int_t * vPivots, int fVerbose )
{
    Vec_Wrd_t * vSigns;
    Gia_Obj_t * pObj, * pObjRi;
    int i, fChange = 1, Counter;

    Gia_ManFillValue( p );
    Gia_ManForEachObjVec( vPivots, p, pObj, i )
        pObj->Value = i;

    if ( fVerbose )
        printf( "Signature propagation: " );
    vSigns = Vec_WrdStart( Gia_ManObjNum(p) );
    while ( fChange )
    {
        fChange = 0;
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( ~pObj->Value )
            {
                assert( pObj->Value >= 0 && pObj->Value < 64 );
                *Vec_WrdEntryP( vSigns, i ) |= ( (word)1 << pObj->Value );
            }
            if ( Gia_ObjIsAnd(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i)) | Vec_WrdEntry(vSigns, Gia_ObjFaninId1(pObj, i));
            else if ( Gia_ObjIsCo(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i));
        }
        Counter = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObj, i )
        {
            word Value = Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj));
            *Vec_WrdEntryP( vSigns, Gia_ObjId(p, pObj) ) |= Vec_WrdEntry(vSigns, Gia_ObjId(p, pObjRi));
            if ( Value != Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj)) )
                fChange = 1, Counter++;
        }
        if ( fVerbose )
            printf( "%d ", Counter );
    }
    if ( fVerbose )
       printf( "\n" );
    return vSigns;
}